

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void hideOrShowWidgetsInLayout(QLayout *layout,bool on)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  undefined1 in_SIL;
  long *in_RDI;
  undefined1 auVar6 [16];
  QWidget *widget;
  QLayoutItem *item;
  int i;
  int iVar7;
  int iVar8;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar9;
  byte bVar10;
  
  uVar9 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  iVar7 = 0;
  while( true ) {
    iVar8 = iVar7;
    uVar1 = (**(code **)(*in_RDI + 200))();
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 <= iVar7) break;
    plVar2 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar8);
    auVar6 = (**(code **)(*plVar2 + 0x68))();
    plVar3 = auVar6._0_8_;
    if (plVar3 == (long *)0x0) {
      lVar4 = (**(code **)(*plVar2 + 0x70))();
      if (lVar4 != 0) {
        (**(code **)(*plVar2 + 0x70))();
        hideOrShowWidgetsInLayout((QLayout *)CONCAT44(uVar9,iVar8),SUB81((ulong)plVar2 >> 0x38,0));
      }
    }
    else {
      bVar10 = (byte)(uVar9 >> 0x18);
      (**(code **)(*plVar3 + 0x68))
                (plVar3,bVar10 & 1,auVar6._8_8_,
                 CONCAT71((int7)(uVar5 >> 8),bVar10) & 0xffffffffffffff01);
    }
    iVar7 = iVar8 + 1;
  }
  return;
}

Assistant:

static void hideOrShowWidgetsInLayout(QLayout *layout, bool on)
{
    for (int i = 0; i < layout->count(); ++i) {
        QLayoutItem *item = layout->itemAt(i);
        if (QWidget *widget = item->widget())
            widget->setVisible(on);
        else if (item->layout())
            hideOrShowWidgetsInLayout(item->layout(), on);
    }
}